

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_attributes_double(void *a,double **attrib)

{
  uint32_t *__src;
  uint32_t uVar1;
  long lVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint8_t *compressed;
  int iVar5;
  int iVar6;
  ulong __size;
  uint32_t nr_of_doubles;
  uint32_t local_34;
  
  iVar5 = 0;
  iVar6 = 0;
  if ((*(int *)((long)a + 0x24) == 0x10) && (iVar6 = iVar5, *(int *)((long)a + 0x40) == 0)) {
    lVar2 = *(long *)((long)a + 0x10);
    puVar3 = *(uint32_t **)((long)a + 0x18);
    uVar4 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
      uVar1 = *puVar3;
      *(uint32_t **)((long)a + 0x18) = puVar3 + 1;
      if ((ulong)((long)(puVar3 + 1) + (4 - lVar2)) <= uVar4) {
        __size = (ulong)puVar3[1];
        __src = puVar3 + 2;
        *(uint32_t **)((long)a + 0x18) = __src;
        compressed = (uint8_t *)malloc(__size);
        if ((long)puVar3 + ((__size + 8) - lVar2) <= uVar4) {
          memcpy(compressed,__src,__size);
          *(ulong *)((long)a + 0x18) = (long)__src + __size;
          if (attrib != (double **)0x0) {
            trico_decompress_double_precision(&local_34,attrib,compressed);
            if (local_34 != uVar1) {
              __assert_fail("nr_of_doubles == nr_attrib",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x581,"int trico_read_attributes_double(void *, double **)");
            }
          }
          free(compressed);
          read_next_stream_type((trico_archive *)a);
          iVar6 = 1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int trico_read_attributes_double(void* a, double** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_double_stream)
    return 0;

  uint32_t nr_attrib;
  if (!read(&nr_attrib, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint32_t nr_of_doubles;

  if (attrib != NULL)
    {
    trico_decompress_double_precision(&nr_of_doubles, attrib, (const uint8_t*)compressed);
    assert(nr_of_doubles == nr_attrib);
    }

  trico_free(compressed);
  

  read_next_stream_type(arch);

  return 1;
  }